

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md.c
# Opt level: O3

int mbedtls_md_clone(mbedtls_md_context_t *dst,mbedtls_md_context_t *src)

{
  mbedtls_md_info_t *pmVar1;
  
  if (dst != (mbedtls_md_context_t *)0x0) {
    pmVar1 = dst->md_info;
    if ((src != (mbedtls_md_context_t *)0x0 && pmVar1 != (mbedtls_md_info_t *)0x0) &&
       (pmVar1 == src->md_info)) {
      (*pmVar1->clone_func)(dst->md_ctx,src->md_ctx);
      return 0;
    }
  }
  return -0x5100;
}

Assistant:

int mbedtls_md_clone( mbedtls_md_context_t *dst,
                      const mbedtls_md_context_t *src )
{
    if( dst == NULL || dst->md_info == NULL ||
        src == NULL || src->md_info == NULL ||
        dst->md_info != src->md_info )
    {
        return( MBEDTLS_ERR_MD_BAD_INPUT_DATA );
    }

    dst->md_info->clone_func( dst->md_ctx, src->md_ctx );

    return( 0 );
}